

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O0

void __thiscall
write_ini_item::operator()(write_ini_item *this,sector_item *item,xr_ini_writer *w,uint32_t id)

{
  string local_100 [48];
  string local_d0 [36];
  int local_ac;
  char local_a8 [4];
  int n;
  char buf [128];
  uint32_t id_local;
  xr_ini_writer *w_local;
  sector_item *item_local;
  write_ini_item *this_local;
  
  buf._124_4_ = id;
  local_ac = snprintf(local_a8,0x80,"item_mesh_name_%04d");
  if (0 < local_ac) {
    std::__cxx11::string::string(local_d0,(string *)&item->mesh);
    xray_re::xr_ini_writer::write(w,(int)local_a8,local_d0,0);
    std::__cxx11::string::~string(local_d0);
  }
  local_ac = snprintf(local_a8,0x80,"item_object_name_%04d");
  if (0 < local_ac) {
    std::__cxx11::string::string(local_100,(string *)item);
    xray_re::xr_ini_writer::write(w,(int)local_a8,local_100,0);
    std::__cxx11::string::~string(local_100);
  }
  return;
}

Assistant:

void operator()(const sector_item& item, xr_ini_writer* w, uint32_t id) const {
	char buf[128];
	int n = xr_snprintf(buf, sizeof(buf), "item_mesh_name_%04d", id);
	if (n > 0)
		w->write(buf, item.mesh, false);

	n = xr_snprintf(buf, sizeof(buf), "item_object_name_%04d", id);
	if (n > 0)
		w->write(buf, item.object, false);
}